

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           *this,longdouble value,format_specs *spec)

{
  byte bVar1;
  alignment aVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it;
  byte bVar7;
  char *pcVar8;
  float_spec_handler handler;
  align_spec as;
  short sStack_290;
  write_inf_or_nan_t write_inf_or_nan;
  double_writer local_260;
  memory_buffer buffer;
  
  sStack_290 = (short)((unkuint10)value >> 0x40);
  handler.type = (spec->super_core_format_specs).type;
  handler.upper = false;
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>(handler.type,&handler);
  if (sStack_290 < 0) {
    value = -value;
    bVar7 = 0x2d;
  }
  else {
    bVar1 = (spec->super_core_format_specs).flags;
    if ((bVar1 & 1) == 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = 0x2b;
      if ((bVar1 & 2) == 0) {
        bVar7 = 0x20;
      }
    }
  }
  write_inf_or_nan.spec.super_align_spec.width_ = (spec->super_align_spec).width_;
  write_inf_or_nan.spec.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  write_inf_or_nan.spec._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  write_inf_or_nan.spec.super_core_format_specs.flags = (spec->super_core_format_specs).flags;
  write_inf_or_nan.spec.super_core_format_specs.type = (spec->super_core_format_specs).type;
  write_inf_or_nan.writer = this;
  write_inf_or_nan.sign = bVar7;
  if (NAN(value)) {
    pcVar6 = "NAN";
    pcVar8 = "    nan";
LAB_001bdc9e:
    pcVar8 = pcVar8 + 4;
    if (handler.upper != false) {
      pcVar8 = pcVar6;
    }
    write_double<long_double>::write_inf_or_nan_t::operator()(&write_inf_or_nan,pcVar8);
    return;
  }
  if ((longdouble)INFINITY <= value) {
    pcVar6 = "INF";
    pcVar8 = "    inf";
    goto LAB_001bdc9e;
  }
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00264c28;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  internal::sprintf_format<long_double>
            (value,&buffer.super_basic_buffer<char>,
             (core_format_specs)
             ((ulong)spec->super_core_format_specs & 0xffff00ffffffffff |
             (ulong)(byte)handler.type << 0x28));
  local_260.n = buffer.super_basic_buffer<char>.size_;
  as.align_ = (spec->super_align_spec).align_;
  as.width_ = (spec->super_align_spec).width_;
  as.fill_ = (spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_DEFAULT) {
    as.align_ = ALIGN_RIGHT;
  }
  else if (aVar2 == ALIGN_NUMERIC) {
    if (bVar7 != 0) {
      pwVar3 = (this->out_).super_truncating_iterator_base<wchar_t_*>.out_;
      uVar4 = (this->out_).super_truncating_iterator_base<wchar_t_*>.count_;
      uVar5 = (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_;
      internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>::operator++
                (&this->out_);
      if (uVar4 < uVar5) {
        *pwVar3 = (uint)bVar7;
      }
      if (as.width_ != 0) {
        as.width_ = as.width_ - 1;
      }
    }
    as.align_ = ALIGN_RIGHT;
    bVar7 = 0;
    goto LAB_001bdd83;
  }
  local_260.n = (buffer.super_basic_buffer<char>.size_ + 1) - (ulong)(bVar7 == 0);
LAB_001bdd83:
  local_260.sign = bVar7;
  local_260.buffer = &buffer.super_basic_buffer<char>;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
  ::
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::double_writer>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
              *)this,&as,&local_260);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}